

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

bool __thiscall BinNE<0,_0,_0>::propagate(BinNE<0,_0,_0> *this)

{
  IntVar *pIVar1;
  IntVar *pIVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  long lVar6;
  int64_t m_v;
  
  pIVar1 = (this->x).var;
  iVar3 = (pIVar1->min).v;
  if (iVar3 == (pIVar1->max).v) {
    pIVar2 = (this->y).var;
    iVar5 = (pIVar2->min).v;
    if (((iVar3 == iVar5) && (iVar5 == (pIVar2->max).v)) &&
       ((uint)(this->r).s * 2 + -1 != (int)sat.assigns.data[(uint)(this->r).v])) {
      if (so.lazy) {
        iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[10])();
        uVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[10])();
        r._a = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
      }
      else {
        r._pt = (Clause *)0x0;
      }
      SAT::cEnqueue(&sat,(Lit)(((this->r).s ^ 1) + (this->r).v * 2),(Reason)r);
      if (sat.confl != (Clause *)0x0) {
        return false;
      }
    }
  }
  pIVar1 = (this->x).var;
  iVar3 = (pIVar1->min).v;
  if (((iVar3 == (pIVar1->max).v) && (pIVar2 = (this->y).var, (pIVar2->min).v <= iVar3)) &&
     ((iVar3 <= (pIVar2->max).v &&
      ((pIVar2->vals == (Tchar *)0x0 || (pIVar2->vals[iVar3].v != '\0')))))) {
    if (so.lazy == true) {
      iVar5 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[10])();
      lVar6 = (long)iVar5 * 4 + 2;
    }
    else {
      lVar6 = 0;
    }
    pIVar1 = (this->y).var;
    iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0x11])(pIVar1,(long)iVar3,lVar6,1)
    ;
    if ((char)iVar3 == '\0') {
      return false;
    }
  }
  pIVar1 = (this->y).var;
  iVar3 = (pIVar1->min).v;
  if (iVar3 != (pIVar1->max).v) {
    return true;
  }
  pIVar2 = (this->x).var;
  if ((pIVar2->min).v <= iVar3) {
    if ((pIVar2->max).v < iVar3) {
      return true;
    }
    if ((pIVar2->vals != (Tchar *)0x0) && (pIVar2->vals[iVar3].v == '\0')) {
      return true;
    }
    if (so.lazy == true) {
      iVar5 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[10])();
      lVar6 = (long)iVar5 * 4 + 2;
    }
    else {
      lVar6 = 0;
    }
    pIVar1 = (this->x).var;
    iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0x11])(pIVar1,(long)iVar3,lVar6,1)
    ;
    if ((char)iVar3 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		if (x.isFixed() && y.isFixed() && x.getVal() == y.getVal()) {
			setDom(r, setVal, 0, x.getValLit(), y.getValLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		if (x.isFixed()) {
			if (R != 0) {
				setDom(y, remVal, x.getVal(), x.getValLit(), r.getValLit());
			} else {
				setDom(y, remVal, x.getVal(), x.getValLit());
			}
		}
		if (y.isFixed()) {
			if (R != 0) {
				setDom(x, remVal, y.getVal(), y.getValLit(), r.getValLit());
			} else {
				setDom(x, remVal, y.getVal(), y.getValLit());
			}
		}

		return true;
	}